

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmRemoveFile(char *name)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,name,&local_29);
  cmsys::SystemTools::RemoveFile(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CCONV cmRemoveFile(const char *name)
{
  cmSystemTools::RemoveFile(name);
}